

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

LONG __thiscall
CorUnix::CPalSynchronizationManager::DoMonitorProcesses
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent)

{
  int iVar1;
  _MonitoredProcessesListNode *p_Var2;
  bool bVar3;
  int iVar4;
  MonitoredProcessesListNode *pMVar5;
  MonitoredProcessesListNode *pMVar6;
  MonitoredProcessesListNode *pMVar7;
  MonitoredProcessesListNode **ppMVar8;
  
  InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  iVar1 = this->m_lMonitoredProcessesCount;
  if (this->m_pmplnMonitoredProcesses == (MonitoredProcessesListNode *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    pMVar6 = this->m_pmplnMonitoredProcesses;
    pMVar7 = (MonitoredProcessesListNode *)0x0;
    do {
      p_Var2 = pMVar6->pNext;
      bVar3 = HasProcessExited(pMVar6->dwPid,&pMVar6->dwExitCode,&pMVar6->fIsActualExitCode);
      pMVar5 = pMVar6;
      if (bVar3) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00349a65;
        pMVar5 = pMVar7;
        if (pMVar7 == (MonitoredProcessesListNode *)0x0) {
          pMVar5 = (MonitoredProcessesListNode *)&this->m_pmplnMonitoredProcesses;
        }
        pMVar5->pNext = p_Var2;
        this->m_lMonitoredProcessesCount = this->m_lMonitoredProcessesCount + -1;
        pMVar6->pNext = this->m_pmplnExitedNodes;
        this->m_pmplnExitedNodes = pMVar6;
        iVar4 = iVar4 + 1;
        pMVar5 = pMVar7;
      }
      pMVar6 = p_Var2;
      pMVar7 = pMVar5;
    } while (p_Var2 != (_MonitoredProcessesListNode *)0x0);
  }
  InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  if (iVar4 < 1) {
    bVar3 = false;
  }
  else {
    AcquireLocalSynchLock(pthrCurrent);
    InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
    ppMVar8 = &this->m_pmplnExitedNodes;
    pMVar6 = (MonitoredProcessesListNode *)ppMVar8;
    do {
      pMVar6 = pMVar6->pNext;
      bVar3 = pMVar6 != (MonitoredProcessesListNode *)0x0;
      if (pMVar6 == (MonitoredProcessesListNode *)0x0) goto LAB_0034999b;
    } while (pMVar6->psdSynchData->m_odObjectDomain != SharedObject);
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
    AcquireSharedSynchLock(pthrCurrent);
    InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
LAB_0034999b:
    pMVar6 = *ppMVar8;
    *ppMVar8 = (MonitoredProcessesListNode *)0x0;
    while (pMVar6 != (MonitoredProcessesListNode *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_00349a65:
        abort();
      }
      p_Var2 = pMVar6->pNext;
      if (pMVar6->fIsActualExitCode == true) {
        *(DWORD *)(pMVar6->pProcLocalData + 8) = pMVar6->dwExitCode;
      }
      *(undefined4 *)(pMVar6->pProcLocalData + 4) = 3;
      CSynchData::SetSignalCount(pMVar6->psdSynchData,1);
      CSynchData::ReleaseAllLocalWaiters(pMVar6->psdSynchData,pthrCurrent);
      CSynchData::Release(pMVar6->psdSynchData,pthrCurrent);
      InternalFree(pMVar6);
      pMVar6 = p_Var2;
    }
  }
  if (0 < iVar4) {
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  }
  if (bVar3) {
    ReleaseSharedSynchLock(pthrCurrent);
  }
  if (0 < iVar4) {
    ReleaseLocalSynchLock(pthrCurrent);
  }
  return iVar1 - iVar4;
}

Assistant:

LONG CPalSynchronizationManager::DoMonitorProcesses(
        CPalThread * pthrCurrent)
    {
        MonitoredProcessesListNode * pNode, * pPrev = NULL, * pNext;
        LONG lInitialNodeCount;
        LONG lRemovingCount = 0;
        bool fLocalSynchLock = false;
        bool fSharedSynchLock = false;
        bool fMonitoredProcessesLock = false;

        // Note: we first need to grab the monitored processes lock to walk
        //       the list of monitored processes, and then, if there is any
        //       which exited, to grab the synchronization lock(s) to signal
        //       the process object. Anyway we cannot grab the synchronization
        //       lock(s) while holding the monitored processes lock; that
        //       would cause deadlock, since RegisterProcessForMonitoring and
        //       UnRegisterProcessForMonitoring call stacks grab the locks
        //       in the opposite order. Grabbing the synch lock(s) first (and
        //       therefore all the times) would cause unacceptable contention
        //       (process monitoring is done in polling mode).
        //       Therefore we need to remove list nodes for processes that
        //       exited copying them to the exited array, while holding only
        //       the monitored processes lock, and then to signal them from that
        //       array holding synch lock(s) and monitored processes lock,
        //       acquired in this order. Holding again the monitored processes
        //       lock is needed in order to support object promotion.

        // Grab the monitored processes lock
        InternalEnterCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = true;

        lInitialNodeCount = m_lMonitoredProcessesCount;

        pNode = m_pmplnMonitoredProcesses;
        while (pNode)
        {
            pNext = pNode->pNext;

            if (HasProcessExited(pNode->dwPid,
                                 &pNode->dwExitCode,
                                 &pNode->fIsActualExitCode))
            {
                TRACE("Process %u exited with return code %u\n",
                      pNode->dwPid,
                      pNode->fIsActualExitCode ? "actual" : "guessed",
                      pNode->dwExitCode);

                if (NULL != pPrev)
                {
                    pPrev->pNext = pNext;
                }
                else
                {
                    m_pmplnMonitoredProcesses = pNext;
                }
                m_lMonitoredProcessesCount--;

                // Insert in the list of nodes for exited processes
                pNode->pNext = m_pmplnExitedNodes;
                m_pmplnExitedNodes = pNode;
                lRemovingCount++;
            }
            else
            {
                pPrev = pNode;
            }

            // Go to the next
            pNode = pNext;
        }

        // Release the monitored processes lock
        InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = false;

        if (lRemovingCount > 0)
        {
            // First grab the local synch lock
            AcquireLocalSynchLock(pthrCurrent);
            fLocalSynchLock = true;

            // Acquire the monitored processes lock
            InternalEnterCriticalSection(pthrCurrent,
                                         &s_csMonitoredProcessesLock);
            fMonitoredProcessesLock = true;

            if (!fSharedSynchLock)
            {
                bool fSharedSynchLockIsNeeded = false;

                // See if the shared lock is needed
                pNode = m_pmplnExitedNodes;
                while (pNode)
                {
                    if (SharedObject == pNode->psdSynchData->GetObjectDomain())
                    {
                        fSharedSynchLockIsNeeded = true;
                        break;
                    }

                    pNode = pNode->pNext;
                }

                if (fSharedSynchLockIsNeeded)
                {
                    // Release the monitored processes lock
                    InternalLeaveCriticalSection(pthrCurrent,
                                                 &s_csMonitoredProcessesLock);
                    fMonitoredProcessesLock = false;

                    // Acquire the shared synch lock
                    AcquireSharedSynchLock(pthrCurrent);
                    fSharedSynchLock = true;

                    // Acquire again the monitored processes lock
                    InternalEnterCriticalSection(pthrCurrent,
                                                 &s_csMonitoredProcessesLock);
                    fMonitoredProcessesLock = true;
                }
            }

            // Start from the beginning of the exited processes list
            pNode = m_pmplnExitedNodes;

            // Invalidate the list
            m_pmplnExitedNodes = NULL;

            while (pNode)
            {
                pNext = pNode->pNext;

                TRACE("Process pid=%u exited with exitcode=%u\n",
                      pNode->dwPid, pNode->dwExitCode);

                // Store the exit code in the process local data
                if (pNode->fIsActualExitCode)
                {
                    pNode->pProcLocalData->dwExitCode = pNode->dwExitCode;
                }

                // Set process status to PS_DONE
                pNode->pProcLocalData->ps = PS_DONE;

                // Set signal count
                pNode->psdSynchData->SetSignalCount(1);

                // Releasing all local waiters
                //
                // We just called directly in CSynchData::SetSignalCount(), so
                // we need to take care of waking up waiting threads according
                // to the Process object semantics (i.e. every thread must be
                // awakend). Anyway if a process object is shared among two or
                // more processes and threads from different processes are
                // waiting on it, the object will be registered for monitoring
                // in each of the processes. As result its signal count will
                // be set to one more times (which is not a problem, given the
                // process object semantics) and each worker thread will wake
                // up waiting threads. Therefore we need to make sure that each
                // worker wakes up only threads in its own process: we do that
                // by calling ReleaseAllLocalWaiters
                pNode->psdSynchData->ReleaseAllLocalWaiters(pthrCurrent);

                // Release the reference to the SynchData
                pNode->psdSynchData->Release(pthrCurrent);

                // Delete the node
                InternalDelete(pNode);

                // Go to the next
                pNode = pNext;
            }
        }

        if (fMonitoredProcessesLock)
        {
            // Release the monitored processes lock
            InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        }
        if (fSharedSynchLock)
        {
            // Release the shared synch lock
            ReleaseSharedSynchLock(pthrCurrent);
        }
        if (fLocalSynchLock)
        {
            // Release the local synch lock
            ReleaseLocalSynchLock(pthrCurrent);
        }

        return (lInitialNodeCount - lRemovingCount);
    }